

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall FBehavior::SerializeVarSet(FBehavior *this,FArchive *arc,SDWORD *vars,int max)

{
  bool bVar1;
  int iVar2;
  int local_30;
  SDWORD truelast;
  SDWORD last;
  SDWORD first;
  SDWORD arcval;
  int max_local;
  SDWORD *vars_local;
  FArchive *arc_local;
  FBehavior *this_local;
  
  first = max;
  _arcval = vars;
  vars_local = (SDWORD *)arc;
  arc_local = (FArchive *)this;
  bVar1 = FArchive::IsStoring(arc);
  if (bVar1) {
    for (truelast = 0; (local_30 = first, truelast < first && (_arcval[truelast] == 0));
        truelast = truelast + 1) {
    }
    do {
      local_30 = local_30 + -1;
      if (local_30 < truelast) break;
    } while (_arcval[local_30] == 0);
    if (local_30 < truelast) {
      last = 0;
      FArchive::operator<<((FArchive *)vars_local,&last);
    }
    else {
      last = (local_30 - truelast) + 1;
      FArchive::operator<<((FArchive *)vars_local,&last);
      last = truelast;
      FArchive::operator<<((FArchive *)vars_local,&last);
      for (; truelast <= local_30; truelast = truelast + 1) {
        FArchive::operator<<((FArchive *)vars_local,_arcval + truelast);
      }
    }
  }
  else {
    memset(_arcval,0,(long)first << 2);
    FArchive::operator<<((FArchive *)vars_local,&local_30);
    if (local_30 != 0) {
      FArchive::operator<<((FArchive *)vars_local,&truelast);
      iVar2 = truelast + local_30;
      local_30 = iVar2;
      if (first < iVar2) {
        local_30 = first;
      }
      for (; truelast < local_30; truelast = truelast + 1) {
        FArchive::operator<<((FArchive *)vars_local,_arcval + truelast);
      }
      for (; truelast < iVar2; truelast = truelast + 1) {
        FArchive::operator<<((FArchive *)vars_local,&last);
      }
    }
  }
  return;
}

Assistant:

void FBehavior::SerializeVarSet (FArchive &arc, SDWORD *vars, int max)
{
	SDWORD arcval;
	SDWORD first, last;

	if (arc.IsStoring ())
	{
		// Find first non-zero variable
		for (first = 0; first < max; ++first)
		{
			if (vars[first] != 0)
			{
				break;
			}
		}

		// Find last non-zero variable
		for (last = max - 1; last >= first; --last)
		{
			if (vars[last] != 0)
			{
				break;
			}
		}

		if (last < first)
		{ // no non-zero variables
			arcval = 0;
			arc << arcval;
			return;
		}

		arcval = last - first + 1;
		arc << arcval;
		arcval = first;
		arc << arcval;

		while (first <= last)
		{
			arc << vars[first];
			++first;
		}
	}
	else
	{
		SDWORD truelast;

		memset (vars, 0, max*sizeof(*vars));

		arc << last;
		if (last == 0)
		{
			return;
		}
		arc << first;
		last += first;
		truelast = last;

		if (last > max)
		{
			last = max;
		}

		while (first < last)
		{
			arc << vars[first];
			++first;
		}
		while (first < truelast)
		{
			arc << arcval;
			++first;
		}
	}
}